

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_findWeekday(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  vm_obj_id_t obj;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  int32_t daytime;
  int delta;
  int my_wday;
  caldate_t cd;
  int32_t dayno;
  CVmTimeZone *tz;
  int32_t which;
  int32_t wday;
  uint argc;
  CVmTimeZone *in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff80;
  int n;
  int in_root_set;
  uint in_stack_ffffffffffffff90;
  CVmTimeZone *in_stack_ffffffffffffffa0;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  in_root_set = n;
  if ((getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_findWeekday::desc,2,1);
    __cxa_guard_release(&getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(in_root_set,in_stack_ffffffffffffff80),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    CVmStack::get(0);
    iVar2 = vm_val_t::num_to_int((vm_val_t *)CONCAT44(in_root_set,in_stack_ffffffffffffff80));
    CVmStack::get(1);
    iVar3 = vm_val_t::num_to_int((vm_val_t *)CONCAT44(in_root_set,in_stack_ffffffffffffff80));
    if (((iVar2 < 1) || (7 < iVar2)) || (iVar3 == 0)) {
      err_throw(0);
    }
    get_tz_arg((uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
    get_local_date((CVmObjDate *)CONCAT44(in_root_set,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
    caldate_t::caldate_t
              ((caldate_t *)CONCAT44(in_root_set,in_stack_ffffffffffffff80),
               (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    iVar1 = caldate_t::weekday((caldate_t *)&stack0xffffffffffffffa0);
    CVmTimeZone::local_to_utc
              (in_stack_ffffffffffffffa0,(int32_t *)CONCAT44(iVar1,((iVar2 + 6) - iVar1) % 7),
               (int32_t *)(ulong)in_stack_ffffffffffffff90);
    obj = create(in_root_set,in_stack_ffffffffffffff80,(int32_t)((ulong)in_RDX >> 0x20));
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_findWeekday(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the day of week and 'which' arguments */
    int32_t wday = G_stk->get(0)->num_to_int(vmg0_);
    int32_t which = G_stk->get(1)->num_to_int(vmg0_);

    /* check the weekday and 'which' ranges */
    if (wday < 1 || wday > 7 || which == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* adjust wday to 0=Sunday */
    wday -= 1;

    /* get my date in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 2, argc);
    int32_t dayno = get_local_date(tz);

    /* figure my weekday */
    caldate_t cd(dayno);
    int my_wday = cd.weekday();

    /* figure the difference between the target day and my day, mod 7 */
    int delta = (7 + wday - my_wday) % 7;

    /* 
     *   Go forward that many days, or backwards (7 - delta), to get the
     *   first occurrence before/after my date.  Then go forwards or
     *   backwards by additional weeks as needed.
     */
    if (which > 0)
        dayno += delta + (which-1)*7;
    else
        dayno -= ((7 - delta) % 7) + (-which-1)*7;

    /* return a new date at midnight on the given day */
    int32_t daytime = 0;
    tz->local_to_utc(dayno, daytime);
    retval->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}